

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

WebPDemuxer * WebPDemuxInternal(WebPData *data,int allow_partial,WebPDemuxState *state,int version)

{
  int *data_00;
  VP8StatusCode VVar1;
  ParseStatus PVar2;
  int iVar3;
  WebPDemuxer *pWVar4;
  Frame *ptr;
  code *pcVar5;
  uint uVar6;
  ulong data_size;
  ChunkParser *pCVar7;
  ulong uVar8;
  WebPDemuxState WVar9;
  bool bVar10;
  WebPBitstreamFeatures local_58;
  
  if (state != (WebPDemuxState *)0x0) {
    *state = WEBP_DEMUX_PARSE_ERROR;
  }
  if ((data != (WebPData *)0x0 && (version & 0xffffff00U) == 0x100) &&
     (data_00 = (int *)data->bytes, data_00 != (int *)0x0)) {
    data_size = data->size;
    WVar9 = WEBP_DEMUX_PARSING_HEADER;
    if (data_size == 0) {
      return (WebPDemuxer *)0x0;
    }
    if (0x13 < data_size) {
      if (((*data_00 == 0x46464952) && (data_00[2] == 0x50424557)) && (0x10 < data_00[1] + 9U)) {
        uVar8 = (ulong)(data_00[1] + 8);
        bVar10 = data_size < uVar8;
        if (uVar8 < data_size) {
          bVar10 = false;
          data_size = uVar8;
        }
        else if ((allow_partial == 0) && (data_size < uVar8)) {
          return (WebPDemuxer *)0x0;
        }
        pWVar4 = (WebPDemuxer *)WebPSafeCalloc(1,0x68);
        if (pWVar4 == (WebPDemuxer *)0x0) {
          return (WebPDemuxer *)0x0;
        }
        pWVar4->state_ = WEBP_DEMUX_PARSING_HEADER;
        pWVar4->canvas_width_ = -1;
        pWVar4->canvas_height_ = -1;
        pWVar4->loop_count_ = 1;
        pWVar4->bgcolor_ = 0xffffffff;
        pWVar4->frames_tail_ = &pWVar4->frames_;
        pWVar4->chunks_tail_ = &pWVar4->chunks_;
        (pWVar4->mem_).start_ = 0xc;
        (pWVar4->mem_).end_ = data_size;
        (pWVar4->mem_).riff_end_ = uVar8;
        (pWVar4->mem_).buf_size_ = data_size;
        (pWVar4->mem_).buf_ = (uint8_t *)data_00;
        if (data_00[3] == 0x20385056) {
          pCVar7 = kMasterChunks;
          pcVar5 = ParseSingleImage;
        }
        else {
          pCVar7 = kMasterChunks;
          do {
            pCVar7 = pCVar7 + 1;
            pcVar5 = pCVar7->parse;
            if (pcVar5 == (_func_ParseStatus_WebPDemuxer_ptr *)0x0) goto LAB_0014e84d;
          } while (*(int *)pCVar7->id != data_00[3]);
        }
        PVar2 = (*pcVar5)(pWVar4);
        if (PVar2 == PARSE_OK) {
          pWVar4->state_ = WEBP_DEMUX_DONE;
        }
        if (((PVar2 == PARSE_ERROR) || (!bVar10 && PVar2 == PARSE_NEED_MORE_DATA)) ||
           (iVar3 = (*pCVar7->valid)(pWVar4), iVar3 == 0)) {
          pWVar4->state_ = WEBP_DEMUX_PARSE_ERROR;
LAB_0014e84d:
          bVar10 = true;
        }
        else {
          bVar10 = false;
        }
        if (state != (WebPDemuxState *)0x0) {
          *state = pWVar4->state_;
        }
        if (bVar10) {
          WebPDemuxDelete(pWVar4);
          return (WebPDemuxer *)0x0;
        }
        return pWVar4;
      }
      VVar1 = WebPGetFeaturesInternal((uint8_t *)data_00,data_size,&local_58,0x209);
      if (VVar1 == VP8_STATUS_OK) {
        pWVar4 = (WebPDemuxer *)WebPSafeCalloc(1,0x68);
        ptr = (Frame *)WebPSafeCalloc(1,0x50);
        if (ptr != (Frame *)0x0 && pWVar4 != (WebPDemuxer *)0x0) {
          pWVar4->state_ = WEBP_DEMUX_PARSING_HEADER;
          pWVar4->canvas_width_ = -1;
          pWVar4->canvas_height_ = -1;
          pWVar4->loop_count_ = 1;
          pWVar4->bgcolor_ = 0xffffffff;
          pWVar4->frames_tail_ = &pWVar4->frames_;
          pWVar4->chunks_tail_ = &pWVar4->chunks_;
          (pWVar4->mem_).start_ = 0;
          (pWVar4->mem_).end_ = data_size;
          (pWVar4->mem_).riff_end_ = 0;
          (pWVar4->mem_).buf_size_ = data_size;
          (pWVar4->mem_).buf_ = (uint8_t *)data_00;
          ptr->img_components_[0].offset_ = 0;
          ptr->img_components_[0].size_ = data_size;
          ptr->width_ = local_58.width;
          ptr->height_ = local_58.height;
          uVar6 = ptr->has_alpha_ | local_58.has_alpha;
          ptr->has_alpha_ = uVar6;
          ptr->frame_num_ = 1;
          ptr->complete_ = 1;
          if ((pWVar4->frames_ == (Frame *)0x0) || (pWVar4->frames_->complete_ != 0)) {
            pWVar4->frames_ = ptr;
            ptr->next_ = (Frame *)0x0;
            pWVar4->feature_flags_ = pWVar4->feature_flags_ | (uint)(uVar6 != 0) << 4;
            pWVar4->frames_tail_ = &ptr->next_;
            pWVar4->state_ = WEBP_DEMUX_DONE;
            pWVar4->canvas_width_ = local_58.width;
            pWVar4->canvas_height_ = local_58.height;
            pWVar4->num_frames_ = 1;
            if (state != (WebPDemuxState *)0x0) {
              *state = WEBP_DEMUX_DONE;
              return pWVar4;
            }
            return pWVar4;
          }
        }
        WebPSafeFree(pWVar4);
        WebPSafeFree(ptr);
        WVar9 = WEBP_DEMUX_PARSE_ERROR;
      }
      else {
        WVar9 = -(uint)(VVar1 != VP8_STATUS_NOT_ENOUGH_DATA);
      }
    }
    if (state != (WebPDemuxState *)0x0) {
      *state = WVar9;
    }
  }
  return (WebPDemuxer *)0x0;
}

Assistant:

WebPDemuxer* WebPDemuxInternal(const WebPData* data, int allow_partial,
                               WebPDemuxState* state, int version) {
  const ChunkParser* parser;
  int partial;
  ParseStatus status = PARSE_ERROR;
  MemBuffer mem;
  WebPDemuxer* dmux;

  if (state != NULL) *state = WEBP_DEMUX_PARSE_ERROR;

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_DEMUX_ABI_VERSION)) return NULL;
  if (data == NULL || data->bytes == NULL || data->size == 0) return NULL;

  if (!InitMemBuffer(&mem, data->bytes, data->size)) return NULL;
  status = ReadHeader(&mem);
  if (status != PARSE_OK) {
    // If parsing of the webp file header fails attempt to handle a raw
    // VP8/VP8L frame. Note 'allow_partial' is ignored in this case.
    if (status == PARSE_ERROR) {
      status = CreateRawImageDemuxer(&mem, &dmux);
      if (status == PARSE_OK) {
        if (state != NULL) *state = WEBP_DEMUX_DONE;
        return dmux;
      }
    }
    if (state != NULL) {
      *state = (status == PARSE_NEED_MORE_DATA) ? WEBP_DEMUX_PARSING_HEADER
                                                : WEBP_DEMUX_PARSE_ERROR;
    }
    return NULL;
  }

  partial = (mem.buf_size_ < mem.riff_end_);
  if (!allow_partial && partial) return NULL;

  dmux = (WebPDemuxer*)WebPSafeCalloc(1ULL, sizeof(*dmux));
  if (dmux == NULL) return NULL;
  InitDemux(dmux, &mem);

  status = PARSE_ERROR;
  for (parser = kMasterChunks; parser->parse != NULL; ++parser) {
    if (!memcmp(parser->id, GetBuffer(&dmux->mem_), TAG_SIZE)) {
      status = parser->parse(dmux);
      if (status == PARSE_OK) dmux->state_ = WEBP_DEMUX_DONE;
      if (status == PARSE_NEED_MORE_DATA && !partial) status = PARSE_ERROR;
      if (status != PARSE_ERROR && !parser->valid(dmux)) status = PARSE_ERROR;
      if (status == PARSE_ERROR) dmux->state_ = WEBP_DEMUX_PARSE_ERROR;
      break;
    }
  }
  if (state != NULL) *state = dmux->state_;

  if (status == PARSE_ERROR) {
    WebPDemuxDelete(dmux);
    return NULL;
  }
  return dmux;
}